

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-million-async.c
# Opt level: O0

int run_benchmark_million_async(void)

{
  uv_async_t *puVar1;
  int iVar2;
  uv_loop_t *puVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  void *eval_b;
  void *eval_a;
  uint i;
  int timeout;
  uv_loop_t *loop;
  uv_async_t *handle;
  uv_timer_t timer_handle;
  
  puVar3 = uv_default_loop();
  container = (async_container *)malloc(0x8000008);
  if (container == (async_container *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-async.c"
            ,0x59,"container","!=","NULL",0,"!=",0);
    abort();
  }
  container->async_events = 0;
  container->handles_seen = 0;
  for (eval_a._0_4_ = 0; (uint)eval_a < 0x100000; eval_a._0_4_ = (uint)eval_a + 1) {
    puVar1 = container->async_handles;
    iVar2 = uv_async_init(puVar3,puVar1 + (uint)eval_a,async_cb);
    if (iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-async.c"
              ,0x5f,"0 == uv_async_init(loop, handle, async_cb)");
      abort();
    }
    puVar1[(uint)eval_a].data = (void *)0x0;
  }
  iVar2 = uv_timer_init(puVar3,(uv_timer_t *)&handle);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-async.c"
            ,99,"0 == uv_timer_init(loop, &timer_handle)");
    abort();
  }
  iVar2 = uv_timer_start((uv_timer_t *)&handle,timer_cb,5000,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-async.c"
            ,100,"0 == uv_timer_start(&timer_handle, timer_cb, timeout, 0)");
    abort();
  }
  iVar2 = uv_thread_create(&thread_id,thread_cb,(void *)0x0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-async.c"
            ,0x65,"0 == uv_thread_create(&thread_id, thread_cb, NULL)");
    abort();
  }
  iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-async.c"
            ,0x66,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  pcVar4 = fmt((double)container->async_events);
  pcVar5 = fmt((double)container->async_events / 5.0);
  pcVar6 = fmt((double)container->handles_seen);
  printf("%s async events in %.1f seconds (%s/s, %s unique handles seen)\n",0x4014000000000000,
         pcVar4,pcVar5,pcVar6);
  free(container);
  puVar3 = uv_default_loop();
  close_loop(puVar3);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-async.c"
            ,0x6e,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

BENCHMARK_IMPL(million_async) {
  uv_timer_t timer_handle;
  uv_async_t* handle;
  uv_loop_t* loop;
  int timeout;
  unsigned i;

  loop = uv_default_loop();
  timeout = 5000;

  container = malloc(sizeof(*container));
  ASSERT_NOT_NULL(container);
  container->async_events = 0;
  container->handles_seen = 0;

  for (i = 0; i < ARRAY_SIZE(container->async_handles); i++) {
    handle = container->async_handles + i;
    ASSERT(0 == uv_async_init(loop, handle, async_cb));
    handle->data = NULL;
  }

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, timeout, 0));
  ASSERT(0 == uv_thread_create(&thread_id, thread_cb, NULL));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  printf("%s async events in %.1f seconds (%s/s, %s unique handles seen)\n",
          fmt(container->async_events),
          timeout / 1000.,
          fmt(container->async_events / (timeout / 1000.)),
          fmt(container->handles_seen));
  free(container);

  MAKE_VALGRIND_HAPPY();
  return 0;
}